

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accessors.h
# Opt level: O0

upb_StringView
upb_Message_GetString(upb_Message *msg,upb_MiniTableField *f,upb_StringView default_val)

{
  upb_CType uVar1;
  upb_FieldRep uVar2;
  upb_MessageValue uVar3;
  upb_MessageValue def;
  upb_MiniTableField *f_local;
  upb_Message *msg_local;
  upb_StringView default_val_local;
  
  uVar1 = upb_MiniTableField_CType(f);
  if (uVar1 != kUpb_CType_String) {
    uVar1 = upb_MiniTableField_CType(f);
    if (uVar1 != kUpb_CType_Bytes) {
      __assert_fail("upb_MiniTableField_CType(f) == kUpb_CType_String || upb_MiniTableField_CType(f) == kUpb_CType_Bytes"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                    ,0x231,
                    "upb_StringView upb_Message_GetString(const struct upb_Message *, const upb_MiniTableField *, upb_StringView)"
                   );
    }
  }
  uVar2 = _upb_MiniTableField_GetRep_dont_copy_me__upb_internal_use_only(f);
  if (uVar2 == kUpb_FieldRep_StringView) {
    uVar3 = upb_Message_GetField(msg,f,default_val);
    return uVar3.str_val;
  }
  __assert_fail("_upb_MiniTableField_GetRep_dont_copy_me__upb_internal_use_only(f) == kUpb_FieldRep_StringView"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                ,0x233,
                "upb_StringView upb_Message_GetString(const struct upb_Message *, const upb_MiniTableField *, upb_StringView)"
               );
}

Assistant:

UPB_API_INLINE upb_StringView
upb_Message_GetString(const struct upb_Message* msg,
                      const upb_MiniTableField* f, upb_StringView default_val) {
  UPB_ASSUME(upb_MiniTableField_CType(f) == kUpb_CType_String ||
             upb_MiniTableField_CType(f) == kUpb_CType_Bytes);
  UPB_ASSUME(UPB_PRIVATE(_upb_MiniTableField_GetRep)(f) ==
             kUpb_FieldRep_StringView);

  upb_MessageValue def;
  def.str_val = default_val;
  return upb_Message_GetField(msg, f, def).str_val;
}